

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall
wasm::Literal::maxInt(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  int32_t iVar1;
  int32_t iVar2;
  
  iVar1 = geti32(this);
  iVar2 = geti32(other);
  if (iVar2 < iVar1) {
    other = this;
  }
  Literal(__return_storage_ptr__,other);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::maxInt(const Literal& other) const {
  return geti32() > other.geti32() ? *this : other;
}